

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmFor(LlvmCompilationContext *ctx,ExprFor *node)

{
  TypeBase *type;
  LoopInfo local_28;
  
  CompileLlvm(ctx,node->initializer);
  local_28.breakBlock = (LLVMBasicBlockRef)&placeholderBasicBlock;
  local_28.continueBlock = (LLVMBasicBlockRef)&placeholderBasicBlock;
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::push_back(&ctx->loopInfo,&local_28);
  CompileLlvm(ctx,node->condition);
  type = GetStackType(ctx,node->condition->type);
  CompileLlvmType(ctx,type);
  CompileLlvm(ctx,node->body);
  CompileLlvm(ctx,node->increment);
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::pop_back(&ctx->loopInfo);
  CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
  return (LLVMValueRef)0x0;
}

Assistant:

LLVMValueRef CompileLlvmFor(LlvmCompilationContext &ctx, ExprFor *node)
{
	CompileLlvm(ctx, node->initializer);

	LLVMBasicBlockRef conditionBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "for_cond");
	LLVMBasicBlockRef bodyBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "for_body");
	LLVMBasicBlockRef iterationBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "for_iter");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "for_exit");

	ctx.loopInfo.push_back(LlvmCompilationContext::LoopInfo(exitBlock, iterationBlock));

	LLVMBuildBr(ctx.builder, conditionBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, conditionBlock);

	LLVMValueRef condition = CompileLlvm(ctx, node->condition);

	condition = LLVMBuildICmp(ctx.builder, LLVMIntNE, condition, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->condition->type)), 0, true), "");

	LLVMBuildCondBr(ctx.builder, condition, bodyBlock, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, bodyBlock);

	CompileLlvm(ctx, node->body);

	LLVMBuildBr(ctx.builder, iterationBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, iterationBlock);

	CompileLlvm(ctx, node->increment);

	LLVMBuildBr(ctx.builder, conditionBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	ctx.loopInfo.pop_back();

	return CheckType(ctx, node, NULL);
}